

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void set_good_speed_features_framesize_independent(AV1_COMP *cpi,SPEED_FEATURES *sf,int speed)

{
  char cVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  undefined1 uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  undefined4 uVar9;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  bool bVar10;
  int use_hbd;
  int allow_screen_content_tools;
  int is_inter_frame;
  int is_boosted_arf2_bwd_type;
  int boosted;
  GF_GROUP *gf_group;
  AV1_COMMON *cm;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 local_50;
  bool local_49;
  undefined4 local_48;
  undefined4 local_44;
  
  lVar2 = *in_RDI;
  lVar8 = lVar2 + 400;
  iVar6 = frame_is_boosted((AV1_COMP *)0x2fb11f);
  bVar10 = true;
  if (iVar6 == 0) {
    bVar10 = *(char *)(lVar8 + (ulong)*(byte *)(in_RDI + 0xe258)) == '\x06';
  }
  cVar1 = *(char *)(lVar2 + 0x1810 + (ulong)*(byte *)(in_RDI + 0xe258));
  bVar3 = *(byte *)((long)in_RDI + 0x3c16f) & 1;
  bVar4 = *(byte *)((long)in_RDI + 0x42773) & 1;
  if ((*(byte *)(in_RDI + 34000) & 1) == 0) {
    *(undefined1 *)(in_RSI + 0xc) = 0;
  }
  uVar5 = 3;
  if (iVar6 != 0) {
    uVar5 = 2;
  }
  *(undefined1 *)(in_RSI + 0x70) = uVar5;
  *(uint *)(in_RSI + 0x74) = (uint)(iVar6 == 0);
  *(undefined4 *)(in_RSI + 0x7c) = 1;
  *(undefined4 *)(in_RSI + 0xa4) = 1;
  *(undefined4 *)(in_RSI + 0x9c) = 1;
  *(undefined4 *)(in_RSI + 0x94) = 1;
  *(undefined4 *)(in_RSI + 0x98) = 2;
  *(undefined4 *)(in_RSI + 0xd4) = 1;
  uVar9 = 3;
  if (bVar4 != 0) {
    uVar9 = 1;
  }
  *(undefined4 *)(in_RSI + 0x108) = uVar9;
  *(undefined4 *)(in_RSI + 0x114) = 1;
  *(undefined4 *)(in_RSI + 0x11c) = 1;
  uVar9 = 0;
  if (bVar3 != 0) {
    uVar9 = 0xffffffff;
  }
  *(undefined4 *)(in_RSI + 0xd0) = uVar9;
  *(undefined4 *)(in_RSI + 0x1b4) = 1;
  *(undefined4 *)(in_RSI + 0x254) = 1;
  *(undefined4 *)(in_RSI + 0x204) = 1;
  *(undefined4 *)(in_RSI + 0x200) = 1;
  if ((iVar6 == 0) && (bVar3 == 0)) {
    local_44 = 2;
    if (bVar10) {
      local_44 = 1;
    }
  }
  else {
    local_44 = 0;
  }
  *(undefined4 *)(in_RSI + 0x1d4) = local_44;
  uVar9 = 2;
  if (iVar6 != 0) {
    uVar9 = 1;
  }
  *(undefined4 *)(in_RSI + 0x1c4) = uVar9;
  *(undefined4 *)(in_RSI + 0x1d0) = 1;
  *(undefined1 *)(in_RSI + 0x23c) = 1;
  *(undefined4 *)(in_RSI + 0x280) = 1;
  *(undefined4 *)(in_RSI + 0x2c8) = 1;
  *(undefined4 *)(in_RSI + 0x344) = 1;
  *(undefined4 *)(in_RSI + 0x30c) = 1;
  *(undefined4 *)(in_RSI + 0x348) = 1;
  *(undefined4 *)(in_RSI + 0x324) = 1;
  *(undefined1 *)(in_RSI + 0x55) = 2;
  *(undefined4 *)(in_RSI + 0x3f0) = 0;
  *(undefined4 *)(in_RSI + 0x408) = 0;
  if (((char)in_RDI[0x13ac6] == '\x01') || ((int)in_RDI[0x13a5f] != 0)) {
    *(undefined4 *)(in_RSI + 0x140) = 0x100000;
  }
  else {
    *(undefined4 *)(in_RSI + 0x140) = 0x2000000;
  }
  *(undefined4 *)(in_RSI + 0x36c) = 1;
  *(undefined1 *)(in_RSI + 0x14) = 1;
  if (0 < in_EDX) {
    *(uint *)(in_RSI + 0x20) = (uint)(bVar3 == 0);
    uVar9 = 2;
    if (bVar3 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0xe8) = uVar9;
    *(undefined4 *)(in_RSI + 0xdc) = 1;
    uVar9 = 2;
    if (bVar3 != 0) {
      uVar9 = 1;
    }
    *(undefined4 *)(in_RSI + 0xd8) = uVar9;
    uVar9 = 3;
    if (bVar4 != 0) {
      uVar9 = 2;
    }
    *(undefined4 *)(in_RSI + 0x108) = uVar9;
    *(int *)(in_RSI + 0x140) = *(int *)(in_RSI + 0x140) << 1;
    *(undefined4 *)(in_RSI + 400) = 1;
    *(undefined1 *)(in_RSI + 0x13e) = 2;
    *(undefined4 *)(in_RSI + 0x1a0) = 1;
    uVar9 = 1;
    if (iVar6 != 0) {
      uVar9 = 2;
    }
    *(undefined4 *)(in_RSI + 0x1fc) = uVar9;
    *(undefined4 *)(in_RSI + 0x1f8) = 1;
    *(uint *)(in_RSI + 500) = (uint)(iVar6 == 0);
    iVar7 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
    if ((iVar7 == 0) && (bVar3 == 0)) {
      local_48 = 2;
      if (iVar6 != 0) {
        local_48 = 1;
      }
    }
    else {
      local_48 = 0;
    }
    *(undefined4 *)(in_RSI + 0x1d4) = local_48;
    uVar9 = 3;
    if (iVar6 != 0) {
      uVar9 = 1;
    }
    *(undefined4 *)(in_RSI + 0x1c4) = uVar9;
    *(undefined4 *)(in_RSI + 0x1f0) = 1;
    *(undefined4 *)(in_RSI + 0x1d0) = 2;
    *(undefined4 *)(in_RSI + 0x27c) = 1;
    *(undefined4 *)(in_RSI + 0x288) = 1;
    *(undefined4 *)(in_RSI + 0x2dc) = 1;
    *(undefined4 *)(in_RSI + 0x344) = 2;
    *(undefined4 *)(in_RSI + 0x308) = 1;
    *(undefined4 *)(in_RSI + 0x304) = 1;
    *(undefined4 *)(in_RSI + 0x310) = 1;
    *(undefined4 *)(in_RSI + 0x348) = 0;
    *(undefined4 *)(in_RSI + 0x32c) = 4000;
    *(undefined1 *)(in_RSI + 0x318) = 2;
    *(undefined4 *)(in_RSI + 0x330) = 1;
    uVar9 = 3;
    if (iVar6 != 0) {
      uVar9 = 2;
    }
    *(undefined4 *)(in_RSI + 0x36c) = uVar9;
    uVar9 = 2;
    if (iVar6 != 0) {
      uVar9 = 1;
    }
    *(undefined4 *)(in_RSI + 0x35c) = uVar9;
    *(undefined4 *)(in_RSI + 0x360) = 1;
    *(undefined4 *)(in_RSI + 0x3a8) = 1;
    *(undefined4 *)(in_RSI + 0x3ac) = 1;
    *(undefined4 *)(in_RSI + 0x50) = 1;
  }
  if (1 < in_EDX) {
    *(undefined1 *)(in_RSI + 4) = 1;
    *(undefined4 *)(in_RSI + 0x38) = 0x19;
    *(undefined4 *)(in_RSI + 0x84) = 2;
    iVar7 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
    *(uint *)(in_RSI + 0x118) = (uint)((iVar7 != 0 ^ 0xffU) & 1);
    *(undefined1 *)(in_RSI + 0x13d) = 1;
    *(undefined4 *)(in_RSI + 0x138) = 1;
    *(undefined4 *)(in_RSI + 0x184) = 1;
    *(undefined4 *)(in_RSI + 0x1c8) = 1;
    *(undefined4 *)(in_RSI + 0x22c) = 100;
    *(undefined4 *)(in_RSI + 0x230) = 1;
    uVar9 = 1;
    if (iVar6 != 0) {
      uVar9 = 4;
    }
    *(undefined4 *)(in_RSI + 0x1fc) = uVar9;
    *(undefined4 *)(in_RSI + 0x208) = 1;
    *(undefined4 *)(in_RSI + 0x210) = 2;
    *(undefined4 *)(in_RSI + 0x1f8) = 2;
    *(undefined4 *)(in_RSI + 0x1d0) = 3;
    *(undefined1 *)(in_RSI + 0x23c) = 2;
    *(undefined4 *)(in_RSI + 0x260) = 1;
    *(undefined4 *)(in_RSI + 0x264) = 1;
    set_txfm_rd_gate_level((int *)(in_RSI + 0x1b8),(uint)(iVar6 == 0));
    *(uint *)(in_RSI + 0x26c) = (uint)(iVar6 == 0);
    *(undefined4 *)(in_RSI + 0x1d8) = 1;
    *(undefined4 *)(in_RSI + 0x294) = 1;
    *(undefined4 *)(in_RSI + 0x284) = 1;
    iVar7 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
    local_49 = true;
    if (iVar7 != 0) {
      local_49 = 1 < *(int *)((long)in_RDI + 0x6079c);
    }
    *(uint *)(in_RSI + 0x2d0) = (uint)local_49;
    *(undefined4 *)(in_RSI + 0x2c8) = 2;
    uVar9 = 1;
    if (cVar1 == '\x01') {
      uVar9 = 2;
    }
    *(undefined4 *)(in_RSI + 0x2c4) = uVar9;
    *(undefined4 *)(in_RSI + 0x300) = 1;
    *(undefined4 *)(in_RSI + 0x58) = 1;
    *(undefined1 *)(in_RSI + 0x55) = 0;
    uVar9 = 4;
    if (bVar10) {
      uVar9 = 3;
    }
    *(undefined4 *)(in_RSI + 0x36c) = uVar9;
    *(undefined4 *)(in_RSI + 0x368) = 1;
    *(undefined4 *)(in_RSI + 0x3c0) = 1;
    *(undefined4 *)(in_RSI + 0x3c4) = 1;
    *(uint *)(in_RSI + 0x3b0) = (uint)(iVar6 == 0);
    *(uint *)(in_RSI + 0x3c8) = (uint)(iVar6 == 0);
    *(undefined4 *)(in_RSI + 0x60) = 0;
    *(undefined4 *)(in_RSI + 0x5c) = 1;
  }
  if (2 < in_EDX) {
    *(undefined1 *)(in_RSI + 0xc) = 1;
    *(undefined4 *)(in_RSI + 0x74) = 1;
    *(undefined4 *)(in_RSI + 0x78) = 1;
    *(undefined4 *)(in_RSI + 0x84) = 0;
    *(undefined4 *)(in_RSI + 0xa4) = 2;
    if (bVar3 == 0) {
      local_50 = 4;
      if (iVar6 != 0) {
        local_50 = 1;
      }
    }
    else {
      local_50 = 0;
    }
    *(undefined4 *)(in_RSI + 0xd0) = local_50;
    *(undefined4 *)(in_RSI + 0xf8) = 1;
    *(undefined4 *)(in_RSI + 0x110) = 1;
    *(undefined4 *)(in_RSI + 0x194) = 1;
    *(undefined1 *)(in_RSI + 0x134) = 1;
    *(undefined1 *)(in_RSI + 0x128) = 0;
    *(undefined4 *)(in_RSI + 0x1a4) = 2;
    *(undefined4 *)(in_RSI + 0x188) = 1;
    *(undefined4 *)(in_RSI + 0x198) = 0;
    *(uint *)(in_RSI + 0x238) = (uint)(iVar6 == 0);
    *(undefined4 *)(in_RSI + 0x240) = 3;
    *(undefined4 *)(in_RSI + 0x21c) = 1;
    *(undefined4 *)(in_RSI + 0x228) = 0xffffffff;
    *(undefined4 *)(in_RSI + 0x1ec) = 1;
    *(uint *)(in_RSI + 0x24c) = (uint)(iVar6 == 0);
    uVar9 = 2;
    if (iVar6 != 0) {
      uVar9 = 4;
    }
    *(undefined4 *)(in_RSI + 0x1fc) = uVar9;
    *(undefined4 *)(in_RSI + 0x1d0) = 5;
    *(undefined4 *)(in_RSI + 600) = 1;
    if (iVar6 == 0) {
      in_stack_ffffffffffffffa4 = 2;
      if (bVar10) {
        in_stack_ffffffffffffffa4 = 1;
      }
    }
    else {
      in_stack_ffffffffffffffa4 = 0;
    }
    set_txfm_rd_gate_level((int *)(in_RSI + 0x1b8),in_stack_ffffffffffffffa4);
    uVar9 = 2;
    if (iVar6 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0x26c) = uVar9;
    *(undefined4 *)(in_RSI + 0x294) = 2;
    *(undefined4 *)(in_RSI + 0x2cc) = 2;
    *(undefined4 *)(in_RSI + 0x2c8) = 3;
    *(undefined4 *)(in_RSI + 0x2dc) = 2;
    *(undefined4 *)(in_RSI + 0x2f0) = 2;
    *(undefined4 *)(in_RSI + 0x58) = 2;
    *(undefined4 *)(in_RSI + 0x50) = 2;
    *(undefined4 *)(in_RSI + 0x48) = 1;
    *(undefined4 *)(in_RSI + 0x4c) = 6;
    *(undefined1 *)(in_RSI + 0x54) = 1;
    *(undefined4 *)(in_RSI + 0x44) = 1;
    uVar9 = 3;
    if (iVar6 != 0) {
      uVar9 = 2;
    }
    *(undefined4 *)(in_RSI + 0x344) = uVar9;
    *(undefined4 *)(in_RSI + 0x328) = 2;
    *(undefined1 *)(in_RSI + 0x318) = 3;
    *(undefined4 *)(in_RSI + 0x370) = 1;
    *(undefined4 *)(in_RSI + 0x37c) = 1;
    if (iVar6 == 0) {
      in_stack_ffffffffffffffa0 = 2;
      if (*(char *)(lVar8 + (ulong)*(byte *)(in_RDI + 0xe258)) == '\x06') {
        in_stack_ffffffffffffffa0 = 1;
      }
    }
    else {
      in_stack_ffffffffffffffa0 = 0;
    }
    *(undefined4 *)(in_RSI + 900) = in_stack_ffffffffffffffa0;
    uVar9 = 4;
    if (iVar6 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0x390) = uVar9;
    uVar9 = 2;
    if (bVar3 != 0) {
      uVar9 = 1;
    }
    *(undefined4 *)(in_RSI + 0x3c4) = uVar9;
    *(undefined4 *)(in_RSI + 0x3c0) = 2;
    iVar7 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
    *(uint *)(in_RSI + 0x398) = (uint)(iVar7 == 0);
    *(undefined4 *)(in_RSI + 0x3d0) = 1;
  }
  if (3 < in_EDX) {
    *(undefined1 *)(in_RSI + 0x134) = 2;
    *(undefined4 *)(in_RSI + 0x78) = 2;
    *(undefined4 *)(in_RSI + 0x80) = 1;
    uVar9 = 2;
    if (bVar3 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0xd0) = uVar9;
    *(undefined4 *)(in_RSI + 0xe0) = 4;
    *(undefined4 *)(in_RSI + 0xf8) = 2;
    *(undefined4 *)(in_RSI + 0x108) = 3;
    in_stack_ffffffffffffff9f = true;
    if (bVar3 == 0) {
      iVar7 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
      in_stack_ffffffffffffff9f = iVar7 != 0;
    }
    *(uint *)(in_RSI + 0xfc) = (uint)((bool)in_stack_ffffffffffffff9f == false);
    *(undefined4 *)(in_RSI + 0x1d8) = 2;
    uVar9 = 3;
    if (iVar6 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0x1b8) = uVar9;
    uVar9 = 5;
    if (iVar6 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0x1bc) = uVar9;
    uVar9 = 3;
    if (iVar6 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0x1c0) = uVar9;
    uVar9 = 2;
    if (iVar6 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0x24c) = uVar9;
    *(undefined4 *)(in_RSI + 0x208) = 2;
    *(undefined4 *)(in_RSI + 0x220) = 0x7fffffff;
    *(undefined4 *)(in_RSI + 0x22c) = 0xffffffff;
    *(undefined4 *)(in_RSI + 0x290) = 1;
    *(undefined4 *)(in_RSI + 0x28c) = 1;
    *(undefined4 *)(in_RSI + 0x288) = 2;
    *(undefined4 *)(in_RSI + 0x2b8) = 0x2007;
    *(undefined4 *)(in_RSI + 700) = 0x2007;
    *(undefined4 *)(in_RSI + 0x2c0) = 0x2007;
    *(undefined4 *)(in_RSI + 0x2c4) = 4;
    *(undefined1 *)(in_RSI + 0x13d) = 2;
    *(undefined4 *)(in_RSI + 0x188) = 2;
    *(undefined1 *)(in_RSI + 0x54) = 2;
    *(undefined1 *)(in_RSI + 0x55) = 9;
    *(undefined4 *)(in_RSI + 0x68) = 1;
    *(undefined4 *)(in_RSI + 0x31c) = 1;
    uVar9 = 7;
    if (bVar10) {
      uVar9 = 5;
    }
    *(undefined4 *)(in_RSI + 0x36c) = uVar9;
    iVar7 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
    uVar5 = 0;
    if (iVar7 != 0) {
      uVar5 = 2;
    }
    *(undefined1 *)(in_RSI + 0x380) = uVar5;
    uVar9 = 2;
    if (iVar6 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0x388) = uVar9;
    *(undefined1 *)(in_RSI + 0x394) = 1;
  }
  if (4 < in_EDX) {
    *(undefined4 *)(in_RSI + 0x28) = 1;
    uVar9 = 2;
    if (bVar3 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0x20) = uVar9;
    *(undefined4 *)(in_RSI + 0x34) = 4;
    uVar9 = 3;
    if (bVar3 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0xd0) = uVar9;
    uVar5 = 6;
    if (bVar3 != 0) {
      uVar5 = 3;
    }
    *(undefined1 *)(in_RSI + 0xec) = uVar5;
    uVar9 = 2;
    if (bVar3 != 0) {
      uVar9 = 1;
    }
    *(undefined4 *)(in_RSI + 0x10c) = uVar9;
    *(undefined1 *)(in_RSI + 0x1ac) = 0;
    *(undefined4 *)(in_RSI + 0x1cc) = 1;
    *(uint *)(in_RSI + 0x1dc) = (uint)!bVar10;
    uVar9 = 4;
    if (iVar6 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0x1b8) = uVar9;
    uVar9 = 5;
    if (iVar6 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0x1c0) = uVar9;
    *(undefined4 *)(in_RSI + 0x260) = 2;
    *(uint *)(in_RSI + 0x298) = (uint)(iVar6 == 0);
    *(undefined4 *)(in_RSI + 0x2cc) = 3;
    iVar7 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
    *(bool *)(in_RSI + 0x380) = iVar7 != 0;
    *(undefined1 *)(in_RSI + 0x3cd) = 1;
    *(undefined1 *)(in_RSI + 0x3ce) = 1;
    *(undefined4 *)(in_RSI + 0x58) = 3;
    *(undefined4 *)(in_RSI + 100) = 1;
    *(undefined1 *)(in_RSI + 0x54) = 3;
    *(undefined4 *)(in_RSI + 0x44) = 2;
    *(undefined4 *)(in_RSI + 0x68) = 2;
    *(undefined4 *)(in_RSI + 0x388) = 2;
    *(undefined4 *)(in_RSI + 0x3c) = 1;
  }
  if (5 < in_EDX) {
    *(undefined4 *)(in_RSI + 0x18) = 1;
    *(undefined4 *)(in_RSI + 0x1c) = 0;
    *(undefined4 *)(in_RSI + 0x80) = 2;
    uVar9 = 3;
    if (iVar6 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0x24c) = uVar9;
    *(undefined4 *)(in_RSI + 0x1d0) = 6;
    uVar9 = 2;
    if (bVar10) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0x1dc) = uVar9;
    *(undefined4 *)(in_RSI + 0x208) = 3;
    *(undefined4 *)(in_RSI + 0x2cc) = 4;
    *(undefined4 *)(in_RSI + 0x2c8) = 4;
    *(undefined4 *)(in_RSI + 700) = 1;
    *(undefined4 *)(in_RSI + 0x2c0) = 1;
    *(undefined4 *)(in_RSI + 0x2a8) = 1;
    *(undefined4 *)(in_RSI + 0x2ac) = 1;
    *(undefined4 *)(in_RSI + 0x2fc) = 1;
    in_stack_ffffffffffffff9e = iVar6 != 0 || bVar3 != 0;
    uVar9 = 2;
    if (iVar6 != 0 || bVar3 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0xfc) = uVar9;
    *(undefined4 *)(in_RSI + 0x98) = 3;
    *(undefined1 *)(in_RSI + 0x13d) = 3;
    *(undefined4 *)(in_RSI + 300) = 1;
    *(undefined4 *)(in_RSI + 0x44) = 3;
    uVar9 = 8;
    if (bVar10) {
      uVar9 = 6;
    }
    *(undefined4 *)(in_RSI + 0x36c) = uVar9;
    *(undefined4 *)(in_RSI + 0x388) = 3;
    *(undefined1 *)(in_RSI + 0x380) = 0;
    *(undefined4 *)(in_RSI + 0x40) = 1;
  }
  if ((int)in_RDI[0x84e6] != 0) {
    set_good_speed_features_lc_dec_framesize_independent
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (SPEED_FEATURES *)
               CONCAT17(in_stack_ffffffffffffff9f,
                        CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
  }
  return;
}

Assistant:

static void set_good_speed_features_framesize_independent(
    const AV1_COMP *const cpi, SPEED_FEATURES *const sf, int speed) {
  const AV1_COMMON *const cm = &cpi->common;
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const int boosted = frame_is_boosted(cpi);
  const int is_boosted_arf2_bwd_type =
      boosted || gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE;
  const int is_inter_frame =
      gf_group->frame_type[cpi->gf_frame_index] == INTER_FRAME;
  const int allow_screen_content_tools =
      cm->features.allow_screen_content_tools;
  const int use_hbd = cpi->oxcf.use_highbitdepth;
  if (!cpi->oxcf.tile_cfg.enable_large_scale_tile) {
    sf->hl_sf.high_precision_mv_usage = LAST_MV_DATA;
  }

  // Speed 0 for all speed features that give neutral coding performance change.
  sf->gm_sf.gm_search_type = boosted ? GM_REDUCED_REF_SEARCH_SKIP_L2_L3_ARF2
                                     : GM_SEARCH_CLOSEST_REFS_ONLY;
  sf->gm_sf.prune_ref_frame_for_gm_search = boosted ? 0 : 1;
  sf->gm_sf.disable_gm_search_based_on_stats = 1;

  sf->part_sf.less_rectangular_check_level = 1;
  sf->part_sf.ml_prune_partition = 1;
  sf->part_sf.prune_ext_partition_types_search_level = 1;
  sf->part_sf.prune_part4_search = 2;
  sf->part_sf.simple_motion_search_prune_rect = 1;
  sf->part_sf.ml_predict_breakout_level = use_hbd ? 1 : 3;
  sf->part_sf.reuse_prev_rd_results_for_part_ab = 1;
  sf->part_sf.use_best_rd_for_pruning = 1;
  sf->part_sf.simple_motion_search_prune_agg =
      allow_screen_content_tools ? NO_PRUNING : SIMPLE_AGG_LVL0;

  // TODO(debargha): Test, tweak and turn on either 1 or 2
  sf->inter_sf.inter_mode_rd_model_estimation = 1;
  sf->inter_sf.model_based_post_interp_filter_breakout = 1;
  sf->inter_sf.prune_compound_using_single_ref = 1;
  sf->inter_sf.prune_mode_search_simple_translation = 1;
  sf->inter_sf.prune_ref_frame_for_rect_partitions =
      (boosted || (allow_screen_content_tools))
          ? 0
          : (is_boosted_arf2_bwd_type ? 1 : 2);
  sf->inter_sf.reduce_inter_modes = boosted ? 1 : 2;
  sf->inter_sf.selective_ref_frame = 1;
  sf->inter_sf.use_dist_wtd_comp_flag = DIST_WTD_COMP_SKIP_MV_SEARCH;

  sf->interp_sf.use_fast_interpolation_filter_search = 1;

  sf->intra_sf.intra_pruning_with_hog = 1;

  sf->tx_sf.adaptive_txb_search_level = 1;
  sf->tx_sf.intra_tx_size_search_init_depth_sqr = 1;
  sf->tx_sf.model_based_prune_tx_search_level = 1;
  sf->tx_sf.tx_type_search.use_reduced_intra_txset = 1;

  sf->tpl_sf.search_method = NSTEP_8PT;

  sf->rt_sf.use_nonrd_pick_mode = 0;
  sf->rt_sf.use_real_time_ref_set = 0;

  if (cpi->twopass_frame.fr_content_type == FC_GRAPHICS_ANIMATION ||
      cpi->use_screen_content_tools) {
    sf->mv_sf.exhaustive_searches_thresh = (1 << 20);
  } else {
    sf->mv_sf.exhaustive_searches_thresh = (1 << 25);
  }

  sf->rd_sf.perform_coeff_opt = 1;
  sf->hl_sf.superres_auto_search_type = SUPERRES_AUTO_DUAL;

  if (speed >= 1) {
    sf->hl_sf.adjust_num_frames_for_arf_filtering =
        allow_screen_content_tools ? 0 : 1;

    sf->part_sf.intra_cnn_based_part_prune_level =
        allow_screen_content_tools ? 0 : 2;
    sf->part_sf.simple_motion_search_early_term_none = 1;
    // TODO(Venkat): Clean-up frame type dependency for
    // simple_motion_search_split in partition search function and set the
    // speed feature accordingly
    sf->part_sf.simple_motion_search_split = allow_screen_content_tools ? 1 : 2;
    sf->part_sf.ml_predict_breakout_level = use_hbd ? 2 : 3;

    sf->mv_sf.exhaustive_searches_thresh <<= 1;
    sf->mv_sf.obmc_full_pixel_search_level = 1;
    sf->mv_sf.use_accurate_subpel_search = USE_4_TAPS;
    sf->mv_sf.disable_extensive_joint_motion_search = 1;

    sf->inter_sf.prune_comp_search_by_single_result = boosted ? 2 : 1;
    sf->inter_sf.prune_comp_type_by_comp_avg = 1;
    sf->inter_sf.prune_comp_type_by_model_rd = boosted ? 0 : 1;
    sf->inter_sf.prune_ref_frame_for_rect_partitions =
        (frame_is_intra_only(&cpi->common) || (allow_screen_content_tools))
            ? 0
            : (boosted ? 1 : 2);
    sf->inter_sf.reduce_inter_modes = boosted ? 1 : 3;
    sf->inter_sf.reuse_inter_intra_mode = 1;
    sf->inter_sf.selective_ref_frame = 2;
    sf->inter_sf.skip_arf_compound = 1;

    sf->interp_sf.use_interp_filter = 1;

    sf->intra_sf.prune_palette_search_level = 1;

    sf->tx_sf.adaptive_txb_search_level = 2;
    sf->tx_sf.inter_tx_size_search_init_depth_rect = 1;
    sf->tx_sf.inter_tx_size_search_init_depth_sqr = 1;
    sf->tx_sf.intra_tx_size_search_init_depth_rect = 1;
    sf->tx_sf.model_based_prune_tx_search_level = 0;
    sf->tx_sf.tx_type_search.ml_tx_split_thresh = 4000;
    sf->tx_sf.tx_type_search.prune_2d_txfm_mode = TX_TYPE_PRUNE_2;
    sf->tx_sf.tx_type_search.skip_tx_search = 1;

    sf->rd_sf.perform_coeff_opt = boosted ? 2 : 3;
    sf->rd_sf.tx_domain_dist_level = boosted ? 1 : 2;
    sf->rd_sf.tx_domain_dist_thres_level = 1;

    sf->lpf_sf.dual_sgr_penalty_level = 1;
    sf->lpf_sf.enable_sgr_ep_pruning = 1;

    // TODO(any, yunqing): move this feature to speed 0.
    sf->tpl_sf.skip_alike_starting_mv = 1;
  }

  if (speed >= 2) {
    sf->hl_sf.recode_loop = ALLOW_RECODE_KFARFGF;

    sf->fp_sf.skip_motion_search_threshold = 25;

    sf->gm_sf.num_refinement_steps = 2;

    sf->part_sf.reuse_best_prediction_for_part_ab =
        !frame_is_intra_only(&cpi->common);

    sf->mv_sf.simple_motion_subpel_force_stop = QUARTER_PEL;
    sf->mv_sf.subpel_iters_per_step = 1;
    sf->mv_sf.reduce_search_range = 1;

    // TODO(chiyotsai@google.com): We can get 10% speed up if we move
    // adaptive_rd_thresh to speed 1. But currently it performs poorly on some
    // clips (e.g. 5% loss on dinner_1080p). We need to examine the sequence a
    // bit more closely to figure out why.
    sf->inter_sf.adaptive_rd_thresh = 1;
    sf->inter_sf.disable_interinter_wedge_var_thresh = 100;
    sf->inter_sf.fast_interintra_wedge_search = 1;
    sf->inter_sf.prune_comp_search_by_single_result = boosted ? 4 : 1;
    sf->inter_sf.prune_ext_comp_using_neighbors = 1;
    sf->inter_sf.prune_comp_using_best_single_mode_ref = 2;
    sf->inter_sf.prune_comp_type_by_comp_avg = 2;
    sf->inter_sf.selective_ref_frame = 3;
    sf->inter_sf.use_dist_wtd_comp_flag = DIST_WTD_COMP_DISABLED;
    sf->inter_sf.enable_fast_compound_mode_search = 1;
    sf->inter_sf.reuse_mask_search_results = 1;
    set_txfm_rd_gate_level(sf->inter_sf.txfm_rd_gate_level, boosted ? 0 : 1);
    sf->inter_sf.inter_mode_txfm_breakout = boosted ? 0 : 1;
    sf->inter_sf.alt_ref_search_fp = 1;

    sf->interp_sf.adaptive_interp_filter_search = 1;
    sf->interp_sf.disable_dual_filter = 1;

    sf->intra_sf.disable_smooth_intra =
        !frame_is_intra_only(&cpi->common) || (cpi->rc.frames_to_key > 1);
    sf->intra_sf.intra_pruning_with_hog = 2;
    sf->intra_sf.skip_intra_in_interframe = is_inter_frame ? 2 : 1;
    sf->intra_sf.skip_filter_intra_in_inter_frames = 1;

    sf->tpl_sf.prune_starting_mv = 1;
    sf->tpl_sf.search_method = DIAMOND;

    sf->rd_sf.perform_coeff_opt = is_boosted_arf2_bwd_type ? 3 : 4;
    sf->rd_sf.use_mb_rd_hash = 1;

    sf->lpf_sf.prune_wiener_based_on_src_var = 1;
    sf->lpf_sf.prune_sgr_based_on_wiener = 1;
    sf->lpf_sf.disable_loop_restoration_chroma = boosted ? 0 : 1;
    sf->lpf_sf.reduce_wiener_window_size = boosted ? 0 : 1;

    // TODO(any): Re-evaluate this feature set to 1 in speed 2.
    sf->tpl_sf.allow_compound_pred = 0;
    sf->tpl_sf.prune_ref_frames_in_tpl = 1;
  }

  if (speed >= 3) {
    sf->hl_sf.high_precision_mv_usage = CURRENT_Q;

    sf->gm_sf.prune_ref_frame_for_gm_search = 1;
    sf->gm_sf.prune_zero_mv_with_sse = 1;
    sf->gm_sf.num_refinement_steps = 0;

    sf->part_sf.less_rectangular_check_level = 2;
    sf->part_sf.simple_motion_search_prune_agg =
        allow_screen_content_tools
            ? SIMPLE_AGG_LVL0
            : (boosted ? SIMPLE_AGG_LVL1 : QIDX_BASED_AGG_LVL1);
    sf->part_sf.prune_ext_part_using_split_info = 1;
    sf->part_sf.simple_motion_search_rect_split = 1;

    sf->mv_sf.full_pixel_search_level = 1;
    sf->mv_sf.subpel_search_method = SUBPEL_TREE_PRUNED;
    sf->mv_sf.search_method = DIAMOND;
    sf->mv_sf.disable_second_mv = 2;
    sf->mv_sf.prune_mesh_search = PRUNE_MESH_SEARCH_LVL_1;
    sf->mv_sf.use_intrabc = 0;

    sf->inter_sf.disable_interinter_wedge_newmv_search = boosted ? 0 : 1;
    sf->inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW;
    sf->inter_sf.disable_onesided_comp = 1;
    sf->inter_sf.disable_interintra_wedge_var_thresh = UINT_MAX;
    // TODO(any): Experiment with the early exit mechanism for speeds 0, 1 and 2
    // and clean-up the speed feature
    sf->inter_sf.perform_best_rd_based_gating_for_chroma = 1;
    sf->inter_sf.prune_inter_modes_based_on_tpl = boosted ? 0 : 1;
    sf->inter_sf.prune_comp_search_by_single_result = boosted ? 4 : 2;
    sf->inter_sf.selective_ref_frame = 5;
    sf->inter_sf.reuse_compound_type_decision = 1;
    set_txfm_rd_gate_level(sf->inter_sf.txfm_rd_gate_level,
                           boosted ? 0 : (is_boosted_arf2_bwd_type ? 1 : 2));
    sf->inter_sf.inter_mode_txfm_breakout = boosted ? 0 : 2;

    sf->interp_sf.adaptive_interp_filter_search = 2;

    // TODO(chiyotsai@google.com): the thresholds chosen for intra hog are
    // inherited directly from luma hog with some minor tweaking. Eventually we
    // should run this with a bayesian optimizer to find the Pareto frontier.
    sf->intra_sf.chroma_intra_pruning_with_hog = 2;
    sf->intra_sf.intra_pruning_with_hog = 3;
    sf->intra_sf.prune_palette_search_level = 2;
    sf->intra_sf.top_intra_model_count_allowed = 2;

    sf->tpl_sf.prune_starting_mv = 2;
    sf->tpl_sf.skip_alike_starting_mv = 2;
    sf->tpl_sf.prune_intra_modes = 1;
    sf->tpl_sf.reduce_first_step_size = 6;
    sf->tpl_sf.subpel_force_stop = QUARTER_PEL;
    sf->tpl_sf.gop_length_decision_method = 1;

    sf->tx_sf.adaptive_txb_search_level = boosted ? 2 : 3;
    sf->tx_sf.tx_type_search.use_skip_flag_prediction = 2;
    sf->tx_sf.tx_type_search.prune_2d_txfm_mode = TX_TYPE_PRUNE_3;

    // TODO(any): Refactor the code related to following winner mode speed
    // features
    sf->winner_mode_sf.enable_winner_mode_for_coeff_opt = 1;
    sf->winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist = 1;
    sf->winner_mode_sf.motion_mode_for_winner_cand =
        boosted                                                          ? 0
        : gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE ? 1
                                                                         : 2;
    sf->winner_mode_sf.prune_winner_mode_eval_level = boosted ? 0 : 4;

    // For screen content, "prune_sgr_based_on_wiener = 2" cause large quality
    // loss.
    sf->lpf_sf.prune_sgr_based_on_wiener = allow_screen_content_tools ? 1 : 2;
    sf->lpf_sf.prune_wiener_based_on_src_var = 2;
    sf->lpf_sf.use_coarse_filter_level_search =
        frame_is_intra_only(&cpi->common) ? 0 : 1;
    sf->lpf_sf.use_downsampled_wiener_stats = 1;
  }

  if (speed >= 4) {
    sf->mv_sf.subpel_search_method = SUBPEL_TREE_PRUNED_MORE;

    sf->gm_sf.prune_zero_mv_with_sse = 2;
    sf->gm_sf.downsample_level = 1;

    sf->part_sf.simple_motion_search_prune_agg =
        allow_screen_content_tools ? SIMPLE_AGG_LVL0 : SIMPLE_AGG_LVL2;
    sf->part_sf.simple_motion_search_reduce_search_steps = 4;
    sf->part_sf.prune_ext_part_using_split_info = 2;
    sf->part_sf.ml_predict_breakout_level = 3;
    sf->part_sf.prune_rectangular_split_based_on_qidx =
        (allow_screen_content_tools || frame_is_intra_only(&cpi->common)) ? 0
                                                                          : 1;

    sf->inter_sf.alt_ref_search_fp = 2;
    sf->inter_sf.txfm_rd_gate_level[TX_SEARCH_DEFAULT] = boosted ? 0 : 3;
    sf->inter_sf.txfm_rd_gate_level[TX_SEARCH_MOTION_MODE] = boosted ? 0 : 5;
    sf->inter_sf.txfm_rd_gate_level[TX_SEARCH_COMP_TYPE_MODE] = boosted ? 0 : 3;

    sf->inter_sf.prune_inter_modes_based_on_tpl = boosted ? 0 : 2;
    sf->inter_sf.prune_ext_comp_using_neighbors = 2;
    sf->inter_sf.prune_obmc_prob_thresh = INT_MAX;
    sf->inter_sf.disable_interinter_wedge_var_thresh = UINT_MAX;

    sf->interp_sf.cb_pred_filter_search = 1;
    sf->interp_sf.skip_sharp_interp_filter_search = 1;
    sf->interp_sf.use_interp_filter = 2;

    sf->intra_sf.intra_uv_mode_mask[TX_16X16] = UV_INTRA_DC_H_V_CFL;
    sf->intra_sf.intra_uv_mode_mask[TX_32X32] = UV_INTRA_DC_H_V_CFL;
    sf->intra_sf.intra_uv_mode_mask[TX_64X64] = UV_INTRA_DC_H_V_CFL;
    // TODO(any): "intra_y_mode_mask" doesn't help much at speed 4.
    // sf->intra_sf.intra_y_mode_mask[TX_16X16] = INTRA_DC_H_V;
    // sf->intra_sf.intra_y_mode_mask[TX_32X32] = INTRA_DC_H_V;
    // sf->intra_sf.intra_y_mode_mask[TX_64X64] = INTRA_DC_H_V;
    sf->intra_sf.skip_intra_in_interframe = 4;

    sf->mv_sf.simple_motion_subpel_force_stop = HALF_PEL;
    sf->mv_sf.prune_mesh_search = PRUNE_MESH_SEARCH_LVL_2;

    sf->tpl_sf.subpel_force_stop = HALF_PEL;
    sf->tpl_sf.search_method = FAST_BIGDIA;
    sf->tpl_sf.use_sad_for_mode_decision = 1;

    sf->tx_sf.tx_type_search.fast_intra_tx_type_search = 1;

    sf->rd_sf.perform_coeff_opt = is_boosted_arf2_bwd_type ? 5 : 7;

    // TODO(any): Extend multi-winner mode processing support for inter frames
    sf->winner_mode_sf.multi_winner_mode_type =
        frame_is_intra_only(&cpi->common) ? MULTI_WINNER_MODE_DEFAULT
                                          : MULTI_WINNER_MODE_OFF;
    sf->winner_mode_sf.dc_blk_pred_level = boosted ? 0 : 2;

    sf->lpf_sf.lpf_pick = LPF_PICK_FROM_FULL_IMAGE_NON_DUAL;
  }

  if (speed >= 5) {
    sf->hl_sf.weight_calc_level_in_tf = 1;
    sf->hl_sf.adjust_num_frames_for_arf_filtering =
        allow_screen_content_tools ? 0 : 2;

    sf->fp_sf.reduce_mv_step_param = 4;

    sf->part_sf.simple_motion_search_prune_agg =
        allow_screen_content_tools ? SIMPLE_AGG_LVL0 : SIMPLE_AGG_LVL3;
    sf->part_sf.ext_partition_eval_thresh =
        allow_screen_content_tools ? BLOCK_8X8 : BLOCK_16X16;
    sf->part_sf.prune_sub_8x8_partition_level =
        allow_screen_content_tools ? 1 : 2;

    sf->mv_sf.warp_search_method = WARP_SEARCH_DIAMOND;

    sf->inter_sf.prune_inter_modes_if_skippable = 1;
    sf->inter_sf.prune_single_ref = is_boosted_arf2_bwd_type ? 0 : 1;
    sf->inter_sf.txfm_rd_gate_level[TX_SEARCH_DEFAULT] = boosted ? 0 : 4;
    sf->inter_sf.txfm_rd_gate_level[TX_SEARCH_COMP_TYPE_MODE] = boosted ? 0 : 5;
    sf->inter_sf.enable_fast_compound_mode_search = 2;

    sf->interp_sf.skip_interp_filter_search = boosted ? 0 : 1;

    sf->intra_sf.chroma_intra_pruning_with_hog = 3;

    // TODO(any): Extend multi-winner mode processing support for inter frames
    sf->winner_mode_sf.multi_winner_mode_type =
        frame_is_intra_only(&cpi->common) ? MULTI_WINNER_MODE_FAST
                                          : MULTI_WINNER_MODE_OFF;

    // Disable Self-guided Loop restoration filter.
    sf->lpf_sf.disable_sgr_filter = true;
    sf->lpf_sf.disable_wiener_coeff_refine_search = true;

    sf->tpl_sf.prune_starting_mv = 3;
    sf->tpl_sf.use_y_only_rate_distortion = 1;
    sf->tpl_sf.subpel_force_stop = FULL_PEL;
    sf->tpl_sf.gop_length_decision_method = 2;
    sf->tpl_sf.use_sad_for_mode_decision = 2;

    sf->winner_mode_sf.dc_blk_pred_level = 2;

    sf->fp_sf.disable_recon = 1;
  }

  if (speed >= 6) {
    sf->hl_sf.disable_extra_sc_testing = 1;
    sf->hl_sf.second_alt_ref_filtering = 0;

    sf->gm_sf.downsample_level = 2;

    sf->inter_sf.prune_inter_modes_based_on_tpl = boosted ? 0 : 3;
    sf->inter_sf.selective_ref_frame = 6;
    sf->inter_sf.prune_single_ref = is_boosted_arf2_bwd_type ? 0 : 2;
    sf->inter_sf.prune_ext_comp_using_neighbors = 3;

    sf->intra_sf.chroma_intra_pruning_with_hog = 4;
    sf->intra_sf.intra_pruning_with_hog = 4;
    sf->intra_sf.intra_uv_mode_mask[TX_32X32] = UV_INTRA_DC;
    sf->intra_sf.intra_uv_mode_mask[TX_64X64] = UV_INTRA_DC;
    sf->intra_sf.intra_y_mode_mask[TX_32X32] = INTRA_DC;
    sf->intra_sf.intra_y_mode_mask[TX_64X64] = INTRA_DC;
    sf->intra_sf.early_term_chroma_palette_size_search = 1;

    sf->part_sf.prune_rectangular_split_based_on_qidx =
        boosted || allow_screen_content_tools ? 0 : 2;

    sf->part_sf.prune_part4_search = 3;

    sf->mv_sf.simple_motion_subpel_force_stop = FULL_PEL;
    sf->mv_sf.use_bsize_dependent_search_method = 1;

    sf->tpl_sf.gop_length_decision_method = 3;

    sf->rd_sf.perform_coeff_opt = is_boosted_arf2_bwd_type ? 6 : 8;

    sf->winner_mode_sf.dc_blk_pred_level = 3;
    sf->winner_mode_sf.multi_winner_mode_type = MULTI_WINNER_MODE_OFF;

    sf->fp_sf.skip_zeromv_motion_search = 1;
  }

  if (cpi->oxcf.enable_low_complexity_decode)
    set_good_speed_features_lc_dec_framesize_independent(cpi, sf);
}